

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTerminatorSymbol::~IfcTerminatorSymbol(IfcTerminatorSymbol *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *pvVar3;
  
  *(undefined8 *)
   &(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem =
       0x85d498;
  *(undefined8 *)&this->field_0xa8 = 0x85d4e8;
  (this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x85d4c0;
  pcVar2 = (this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
           super_IfcStyledItem.Name.ptr._M_dataplus._M_p;
  paVar1 = &(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
            super_IfcStyledItem.Name.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pvVar3 = *(void **)&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
                      super_IfcStyledItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&(this->super_IfcAnnotationSymbolOccurrence).
                                     super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x40 -
                           (long)pvVar3);
  }
  operator_delete(this,0xc0);
  return;
}

Assistant:

IfcTerminatorSymbol() : Object("IfcTerminatorSymbol") {}